

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int consume_socket(mg_context *ctx,socket *sp,int thread_index)

{
  bool bVar1;
  int thread_index_local;
  socket *sp_local;
  mg_context *ctx_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&ctx->thread_mutex);
  while( true ) {
    bVar1 = false;
    if (ctx->sq_head == ctx->sq_tail) {
      bVar1 = ctx->stop_flag == 0;
    }
    if (!bVar1) break;
    pthread_cond_wait((pthread_cond_t *)&ctx->sq_full,(pthread_mutex_t *)&ctx->thread_mutex);
  }
  if (ctx->sq_tail < ctx->sq_head) {
    memcpy(sp,ctx->squeue + ctx->sq_tail % ctx->sq_size,0x40);
    ctx->sq_tail = ctx->sq_tail + 1;
    while (ctx->sq_size < ctx->sq_tail) {
      ctx->sq_tail = ctx->sq_tail - ctx->sq_size;
      ctx->sq_head = ctx->sq_head - ctx->sq_size;
    }
  }
  pthread_cond_signal((pthread_cond_t *)&ctx->sq_empty);
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->thread_mutex);
  return (int)(ctx->stop_flag == 0);
}

Assistant:

static int
consume_socket(struct mg_context *ctx, struct socket *sp, int thread_index)
{
	(void)thread_index;

	(void)pthread_mutex_lock(&ctx->thread_mutex);
	DEBUG_TRACE("%s", "going idle");

	/* If the queue is empty, wait. We're idle at this point. */
	while ((ctx->sq_head == ctx->sq_tail)
	       && (STOP_FLAG_IS_ZERO(&ctx->stop_flag))) {
		pthread_cond_wait(&ctx->sq_full, &ctx->thread_mutex);
	}

	/* If we're stopping, sq_head may be equal to sq_tail. */
	if (ctx->sq_head > ctx->sq_tail) {
		/* Copy socket from the queue and increment tail */
		*sp = ctx->squeue[ctx->sq_tail % ctx->sq_size];
		ctx->sq_tail++;

		DEBUG_TRACE("grabbed socket %d, going busy", sp ? sp->sock : -1);

		/* Wrap pointers if needed */
		while (ctx->sq_tail > ctx->sq_size) {
			ctx->sq_tail -= ctx->sq_size;
			ctx->sq_head -= ctx->sq_size;
		}
	}

	(void)pthread_cond_signal(&ctx->sq_empty);
	(void)pthread_mutex_unlock(&ctx->thread_mutex);

	return STOP_FLAG_IS_ZERO(&ctx->stop_flag);
}